

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

bool __thiscall cinatra::is_valid_utf8(cinatra *this,uchar *s,size_t length)

{
  cinatra *pcVar1;
  cinatra *pcVar2;
  byte bVar3;
  cinatra *pcVar4;
  bool bVar5;
  
  bVar3 = (byte)length;
  bVar5 = s == (uchar *)0x0;
  if (!bVar5) {
    pcVar4 = (cinatra *)(s + (long)this);
    do {
      pcVar1 = this + 4;
      if ((pcVar4 < pcVar1) || ((*(uint *)this & 0x80808080) != 0)) {
        pcVar1 = this + 2;
        goto LAB_001e94f2;
      }
      bVar5 = pcVar1 == pcVar4;
      this = pcVar1;
    } while (!bVar5);
LAB_001e965b:
    bVar3 = 0;
  }
  goto LAB_001e9663;
  while (pcVar2 = pcVar1 + -1, pcVar1 = pcVar1 + 1, pcVar2 != pcVar4) {
LAB_001e94f2:
    if ((char)pcVar1[-2] < '\0') {
      if ((((byte)pcVar1[-2] & 0x60) != 0x40) || (pcVar4 <= pcVar1 + -1)) goto LAB_001e965b;
      bVar3 = 0;
      goto LAB_001e9663;
    }
  }
  bVar3 = 1;
LAB_001e9663:
  return (bool)(bVar5 | bVar3 & 1);
}

Assistant:

inline bool is_valid_utf8(unsigned char *s, size_t length) {
  for (unsigned char *e = s + length; s != e;) {
    if (s + 4 <= e && ((*(uint32_t *)s) & 0x80808080) == 0) {
      s += 4;
    }
    else {
      while (!(*s & 0x80)) {
        if (++s == e) {
          return true;
        }
      }

      if ((s[0] & 0x60) == 0x40) {
        if (s + 1 >= e || (s[1] & 0xc0) != 0x80 || (s[0] & 0xfe) == 0xc0) {
          return false;
        }
        s += 2;
      }
      else if ((s[0] & 0xf0) == 0xe0) {
        if (s + 2 >= e || (s[1] & 0xc0) != 0x80 || (s[2] & 0xc0) != 0x80 ||
            (s[0] == 0xe0 && (s[1] & 0xe0) == 0x80) ||
            (s[0] == 0xed && (s[1] & 0xe0) == 0xa0)) {
          return false;
        }
        s += 3;
      }
      else if ((s[0] & 0xf8) == 0xf0) {
        if (s + 3 >= e || (s[1] & 0xc0) != 0x80 || (s[2] & 0xc0) != 0x80 ||
            (s[3] & 0xc0) != 0x80 || (s[0] == 0xf0 && (s[1] & 0xf0) == 0x80) ||
            (s[0] == 0xf4 && s[1] > 0x8f) || s[0] > 0xf4) {
          return false;
        }
        s += 4;
      }
      else {
        return false;
      }
    }
  }
  return true;
}